

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktQueryPoolTests.cpp
# Opt level: O0

void vkt::QueryPool::anon_unknown_1::createChildren(TestCaseGroup *queryPoolTests)

{
  TestContext *testCtx_00;
  TestNode *pTVar1;
  TestContext *testCtx;
  TestCaseGroup *queryPoolTests_local;
  
  testCtx_00 = tcu::TestNode::getTestContext(&queryPoolTests->super_TestNode);
  pTVar1 = (TestNode *)operator_new(0x70);
  QueryPoolOcclusionTests::QueryPoolOcclusionTests((QueryPoolOcclusionTests *)pTVar1,testCtx_00);
  tcu::TestNode::addChild(&queryPoolTests->super_TestNode,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x70);
  QueryPoolStatisticsTests::QueryPoolStatisticsTests((QueryPoolStatisticsTests *)pTVar1,testCtx_00);
  tcu::TestNode::addChild(&queryPoolTests->super_TestNode,pTVar1);
  return;
}

Assistant:

void createChildren (tcu::TestCaseGroup* queryPoolTests)
{
	tcu::TestContext&	testCtx		= queryPoolTests->getTestContext();

	queryPoolTests->addChild(new QueryPoolOcclusionTests(testCtx));
	queryPoolTests->addChild(new QueryPoolStatisticsTests(testCtx));
}